

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dmr.cpp
# Opt level: O2

void __thiscall DSDcc::DSDDMR::processSyncOrSkip(DSDDMR *this)

{
  uint uVar1;
  DSDDecoder *pDVar2;
  DSDFSMState DVar3;
  bool bVar4;
  int iVar5;
  ulong uVar6;
  SyncPattern patterns [2];
  DSDSync syncEngine;
  
  patterns[0] = SyncDMRDataBS;
  patterns[1] = SyncDMRVoiceBS;
  iVar5 = this->m_symbolIndex;
  if (iVar5 < 0x19) {
LAB_00113c44:
    iVar5 = iVar5 + 1;
LAB_00113c46:
    this->m_symbolIndex = iVar5;
    this->m_cachSymbolIndex = this->m_cachSymbolIndex + 1;
  }
  else {
    pDVar2 = this->m_dsdDecoder;
    uVar1 = (pDVar2->m_dsdSymbol).m_syncSymbolBuffer.m_size;
    iVar5 = (pDVar2->m_dsdSymbol).m_syncSymbolBuffer.m_index;
    uVar6 = (ulong)iVar5;
    if (0x18 < uVar1) {
      uVar6 = (ulong)((uVar1 + iVar5) - 0x18) % (ulong)uVar1;
    }
    DSDSync::matchSome(&syncEngine,(pDVar2->m_dsdSymbol).m_syncSymbolBuffer.m_buffer + uVar6,0x18,
                       patterns,2);
    bVar4 = DSDSync::isMatching(&syncEngine,SyncDMRDataBS);
    if (bVar4) {
      processDataFirstHalf(this,0x5a);
      DVar3 = DSDprocessDMRdata;
    }
    else {
      bVar4 = DSDSync::isMatching(&syncEngine,SyncDMRVoiceBS);
      if (!bVar4) {
        iVar5 = this->m_symbolIndex;
        if (iVar5 != 0x8f) goto LAB_00113c44;
        this->m_slot = (int)(this->m_slot + DSDDMRSlot2) % 2;
        this->m_continuation = true;
        this->m_dsdDecoder->m_fsmState = DSDprocessDMRvoice;
        iVar5 = 0;
        goto LAB_00113c46;
      }
      processVoiceFirstHalf(this,0x5a);
      DVar3 = DSDprocessDMRvoice;
    }
    this->m_dsdDecoder->m_fsmState = DVar3;
  }
  return;
}

Assistant:

void DSDDMR::processSyncOrSkip()
{
    const int sync_db_size = IN_DIBITS(DMR_SYNC_LEN);
    const DSDSync::SyncPattern patterns[2] = { DSDSync::SyncDMRDataBS, DSDSync::SyncDMRVoiceBS };

    if (m_symbolIndex > sync_db_size) // accumulate enough symbols to look for a sync
    {
        DSDSync syncEngine;
        syncEngine.matchSome(m_dsdDecoder->m_dsdSymbol.getSyncDibitBack(sync_db_size), sync_db_size, patterns, 2);

        if (syncEngine.isMatching(DSDSync::SyncDMRDataBS))
        {
//		    std::cerr << "DSDDMR::processSyncOrSkip: data sync" << std::endl;
            processDataFirstHalf(90);
            m_dsdDecoder->m_fsmState = DSDDecoder::DSDprocessDMRdata;
            return;
        }
        else if (syncEngine.isMatching(DSDSync::SyncDMRVoiceBS))
        {
//		    std::cerr << "DSDDMR::processSyncOrSkip: voice sync" << std::endl;
            processVoiceFirstHalf(90);
            m_dsdDecoder->m_fsmState = DSDDecoder::DSDprocessDMRvoice;
            return;
        }
    }

    if (m_symbolIndex == IN_DIBITS(DMR_TS_LEN) - 1) // last dibit
    {
        // return to voice super frame
        m_slot = (DSDDMRSlot) (((int) m_slot + 1) % 2); // to keep the slot in the next slot period fake a slot reversal
        m_continuation = true;
        m_dsdDecoder->m_fsmState = DSDDecoder::DSDprocessDMRvoice;
        m_symbolIndex = 0;
    }
    else
    {
        m_symbolIndex++;
    }

    m_cachSymbolIndex++; // last dibit counts
}